

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O0

void compute_vels(float (*Ix) [512],float (*Iy) [512],float (*It) [512],float (*full_vels) [512] [2]
                 ,float (*norm_vels1) [512] [2],float (*norm_vels2) [512] [2],int pic_x,int pic_y,
                 int n,float tau_D,int flag,float (*E) [512])

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  uint local_1b4;
  int kk;
  int mag_zero;
  float v [2];
  float coeff [5];
  float local_18c;
  float local_188;
  float sum;
  float weight [5] [5];
  float eigenvectors2 [2] [2];
  float eigenvalues2 [2];
  int no_swaps;
  int eigen_count;
  int nrot;
  int no_count;
  int norm_count2;
  int norm_count1;
  int full_count;
  int l;
  int k;
  int j;
  int i;
  float diff2 [2];
  float diff1 [2];
  float temp;
  float sigmap;
  float sigma2;
  float sigma1;
  float v2;
  float v1;
  float temp1;
  float angle;
  float length2;
  float length1;
  float eigenvectors [2] [2];
  float local_7c;
  float local_78;
  float eigenvalues [2];
  float denominator;
  float B [2];
  float MI [2] [2];
  float M [2] [2];
  float local_40;
  float mag;
  float tau_D_local;
  float (*norm_vels2_local) [512] [2];
  float (*norm_vels1_local) [512] [2];
  float (*full_vels_local) [512] [2];
  float (*It_local) [512];
  float (*Iy_local) [512];
  float (*Ix_local) [512];
  
  printf("Eigenvalue Threshold: %f\n",(double)tau_D);
  printf("Threshold on Raw Normal Velocities: %f\n",(double)RAW_MAG);
  MAX_RAW_MAG = -INFINITY;
  local_1b4 = 0;
  fflush(_stdout);
  local_18c = 0.0;
  v[0] = 0.0625;
  v[1] = 0.25;
  printf("Coefficients\n");
  for (k = 0; k < 5; k = k + 1) {
    for (l = 0; l < 5; l = l + 1) {
      (&local_188)[(long)k * 5 + (long)l] = v[k] * v[l];
      printf("%12.8f \n",(double)(&local_188)[(long)k * 5 + (long)l]);
      local_18c = (&local_188)[(long)k * 5 + (long)l] + local_18c;
    }
    printf("\n");
  }
  printf("Sum=%f\n",(double)local_18c);
  norm_count2 = 0;
  nrot = 0;
  no_count = 0;
  eigen_count = 0;
  eigenvalues2[1] = 0.0;
  for (k = 0; k < 0x200; k = k + 1) {
    for (l = 0; l < 0x200; l = l + 1) {
      full_vels[k][l][1] = 100.0;
      full_vels[k][l][0] = 100.0;
      norm_vels1[k][l][1] = 100.0;
      norm_vels1[k][l][0] = 100.0;
      norm_vels2[k][l][1] = 100.0;
      norm_vels2[k][l][0] = 100.0;
      E[k][l] = 0.0;
      Imag[k][l] = 0.0;
    }
  }
  for (k = n; k < pic_x - n; k = k + 1) {
    for (l = n; l < pic_y - n; l = l + 1) {
      MI[1][1] = 0.0;
      M[0][1] = 0.0;
      MI[1][0] = 0.0;
      denominator = 0.0;
      eigenvalues[1] = 0.0;
      local_40 = 1.0;
      for (full_count = -2; full_count < 3; full_count = full_count + 1) {
        for (norm_count1 = -2; norm_count1 < 3; norm_count1 = norm_count1 + 1) {
          if (flag == 1) {
            local_40 = (Ix[k + full_count][l + norm_count1] * Ix[k + full_count][l + norm_count1] +
                       Iy[k + full_count][l + norm_count1] * Iy[k + full_count][l + norm_count1]) *
                       0.08 + 1.0;
          }
          MI[1][0] = MI[1][0] +
                     ((&local_188)[(long)(full_count + 2) * 5 + (long)(norm_count1 + 2)] *
                     Ix[k + full_count][l + norm_count1] * Ix[k + full_count][l + norm_count1]) /
                     local_40;
          M[0][1] = M[0][1] + ((&local_188)[(long)(full_count + 2) * 5 + (long)(norm_count1 + 2)] *
                              Iy[k + full_count][l + norm_count1] *
                              Iy[k + full_count][l + norm_count1]) / local_40;
          MI[1][1] = MI[1][1] +
                     ((&local_188)[(long)(full_count + 2) * 5 + (long)(norm_count1 + 2)] *
                     Ix[k + full_count][l + norm_count1] * Iy[k + full_count][l + norm_count1]) /
                     local_40;
          eigenvalues[1] =
               eigenvalues[1] +
               ((&local_188)[(long)(full_count + 2) * 5 + (long)(norm_count1 + 2)] *
               Ix[k + full_count][l + norm_count1] * It[k + full_count][l + norm_count1]) / local_40
          ;
          denominator = denominator +
                        ((&local_188)[(long)(full_count + 2) * 5 + (long)(norm_count1 + 2)] *
                        Iy[k + full_count][l + norm_count1] * It[k + full_count][l + norm_count1]) /
                        local_40;
        }
      }
      if (flag == 1) {
        MI[1][0] = MI[1][0] + 0.5;
        M[0][1] = M[0][1] + 0.5;
      }
      eigenvalues[0] = MI[1][0] * M[0][1] + -(MI[1][1] * MI[1][1]);
      fVar3 = M[0][1] / eigenvalues[0];
      fVar4 = -MI[1][1] / eigenvalues[0];
      MI[0][0] = -MI[1][1] / eigenvalues[0];
      MI[0][1] = MI[1][0] / eigenvalues[0];
      jacobi(MI + 1,2,&local_7c,(float (*) [2])&length2,&no_swaps);
      iVar1 = check_eigen_calc(MI + 1,&local_7c,(float (*) [2])&length2,no_swaps,diff2,(float *)&j,
                               &angle,&temp1,&v1);
      fVar5 = local_7c;
      fVar2 = eigenvectors[0][0];
      fVar6 = length2;
      if (iVar1 == 0) {
        eigenvalues2[1] = (float)((int)eigenvalues2[1] + 1);
      }
      else {
        if (local_7c < local_78) {
          local_7c = local_78;
          local_78 = fVar5;
          length2 = length1;
          length1 = fVar6;
          eigenvectors[0][0] = eigenvectors[0][1];
          eigenvectors[0][1] = fVar2;
        }
        if ((local_7c < tau_D) || (local_78 < tau_D)) {
          if ((local_7c <= tau_D) || (ABS(eigenvalues[0]) <= 1e-08)) {
            eigen_count = eigen_count + 1;
          }
          else {
            fVar6 = -(fVar3 * eigenvalues[1] + fVar4 * denominator);
            fVar2 = -(MI[0][0] * eigenvalues[1] + MI[0][1] * denominator);
            norm_vels1[k][l][1] = -(fVar6 * length2 + fVar2 * eigenvectors[0][0]) * length2;
            norm_vels1[k][l][0] =
                 (fVar6 * length2 + fVar2 * eigenvectors[0][0]) * eigenvectors[0][0];
            no_count = no_count + 1;
          }
        }
        else if (eigenvalues[0] <= 0.0) {
          full_vels[k][l][1] = 100.0;
          full_vels[k][l][0] = 100.0;
        }
        else {
          fVar6 = -(fVar3 * eigenvalues[1] + fVar4 * denominator);
          full_vels[k][l][1] = -fVar6;
          fVar2 = -(MI[0][0] * eigenvalues[1] + MI[0][1] * denominator);
          full_vels[k][l][0] = fVar2;
          for (full_count = -2; full_count < 3; full_count = full_count + 1) {
            for (norm_count1 = -2; norm_count1 < 3; norm_count1 = norm_count1 + 1) {
              fVar5 = (&local_188)[(long)(full_count + 2) * 5 + (long)(norm_count1 + 2)] *
                      (Ix[k + full_count][l + norm_count1] * fVar6 +
                       Iy[k + full_count][l + norm_count1] * fVar2 +
                      It[k + full_count][l + norm_count1]);
              E[k][l] = fVar5 * fVar5 + E[k][l];
            }
          }
          norm_count2 = norm_count2 + 1;
        }
      }
      fVar6 = Ix[k][l] * Ix[k][l] + Iy[k][l] * Iy[k][l];
      dVar7 = sqrt((double)fVar6);
      Imag[k][l] = (float)dVar7;
      if (MAX_RAW_MAG < Imag[k][l]) {
        MAX_RAW_MAG = Imag[k][l];
      }
      if (Imag[k][l] <= RAW_MAG) {
        local_1b4 = local_1b4 + 1;
      }
      else {
        norm_vels2[k][l][1] = (It[k][l] * Ix[k][l]) / fVar6;
        norm_vels2[k][l][0] = (-It[k][l] * Iy[k][l]) / fVar6;
        nrot = nrot + 1;
      }
    }
  }
  printf("%d full velocities computed\n",(ulong)(uint)norm_count2);
  printf("%d least squares normal velocities computed\n",(ulong)(uint)no_count);
  printf("%d raw normal velocities computed\n",(ulong)(uint)nrot);
  printf("%d locations where velocity information thresholded\n",(ulong)(uint)eigen_count);
  printf("%d locations where eigenvalue/eigenvector calculation failed\n",
         (ulong)(uint)eigenvalues2[1]);
  printf("%d locations with spatial gradient is zero\n",(ulong)local_1b4);
  fflush(_stdout);
  return;
}

Assistant:

void compute_vels(
float Ix[PIC_X][PIC_Y],
float Iy[PIC_X][PIC_Y],
float It[PIC_X][PIC_Y],
float full_vels[PIC_X][PIC_Y][2],
float norm_vels1[PIC_X][PIC_Y][2],
float norm_vels2[PIC_X][PIC_Y][2],
int pic_x, int pic_y, int n,
float tau_D,
int flag, float E[PIC_X][PIC_Y])
{
float mag,M[2][2],MI[2][2],B[2],denominator;
float eigenvalues[2],eigenvectors[2][2],length1,length2;
float angle,temp1,v1,v2;
float sigma1,sigma2,sigmap,temp,diff1[N],diff2[N];
int i,j,k,l,full_count,norm_count1,norm_count2,no_count,nrot,eigen_count,no_swaps;
float eigenvalues2[2],eigenvectors2[2][2],weight[5][5],sum,coeff[5],v[2];
int mag_zero;
int kk;


printf("Eigenvalue Threshold: %f\n",tau_D);
printf("Threshold on Raw Normal Velocities: %f\n",RAW_MAG);
MAX_RAW_MAG = (float) -HUGE_VAL;
mag_zero = 0;
fflush(stdout);
/* Parameter values as specified in Simoncelli, Adelson and Heeger, page 313  */
sigma1 = 0.08f;
sigma2 = 1.0f;
sigmap = 2.0f;

/* Compute weights */
sum = 0.0;
coeff[0] = coeff[4] = 0.0625;
coeff[1] = coeff[3] = 0.25;
coeff[2] = 0.375;
printf("Coefficients\n");
for(i=0;i<5;i++)
{
for(j=0;j<5;j++)
	{
	weight[i][j] = coeff[i]*coeff[j];
	printf("%12.8f \n",weight[i][j]);
	sum += weight[i][j];
	}
printf("\n");
}
printf("Sum=%f\n",sum);
full_count = 0;
norm_count1 = norm_count2 = 0;
no_count = 0;
eigen_count = 0;
no_swaps = 0;
for(i=0;i<PIC_X;i++)
for(j=0;j<PIC_Y;j++)
	{
	full_vels[i][j][0] = full_vels[i][j][1] = NO_VALUE;
	norm_vels1[i][j][0] = norm_vels1[i][j][1] = NO_VALUE;
	norm_vels2[i][j][0] = norm_vels2[i][j][1] = NO_VALUE;
	if(DEBUG) for(kk=0;kk<8;kk++) data[kk][i][j] = 0.0;
	Imag[i][j] = E[i][j] = 0.0;
	}

for(i=n;i<pic_x-n;i++)
for(j=n;j<pic_y-n;j++)
	{
	M[0][0] = M[1][1] = M[0][1] = M[1][0] = 0.0;
	B[0] = B[1] = 0.0;
	mag = 1.0;
	/* Compute on 5*5 neighbourhood */
	for(k=(-2);k<=2;k++)
	for(l=(-2);l<=2;l++)
		{
		if(flag==TRUE) mag = sigma1*(Ix[i+k][j+l]*Ix[i+k][j+l]+
		                             Iy[i+k][j+l]*Iy[i+k][j+l])+sigma2;
		M[0][0] = M[0][0] + weight[k+2][l+2]*(Ix[i+k][j+l]*Ix[i+k][j+l])/mag;
		M[1][1] = M[1][1] + weight[k+2][l+2]*(Iy[i+k][j+l]*Iy[i+k][j+l])/mag;
		M[0][1] = M[0][1] + weight[k+2][l+2]*(Ix[i+k][j+l]*Iy[i+k][j+l])/mag;
		B[0] = B[0] + weight[k+2][l+2]*(Ix[i+k][j+l]*It[i+k][j+l])/mag;
		B[1] = B[1] + weight[k+2][l+2]*(Iy[i+k][j+l]*It[i+k][j+l])/mag;
		}
	if(DEBUG)
	{
	data[0][i][j] = M[0][0];
	data[1][i][j] = M[0][1];
	data[2][i][j] = M[1][1];
	data[3][i][j] = B[0];
	data[4][i][j] = B[1];
	data[5][i][j] = Ix[i][j];
	data[6][i][j] = Iy[i][j];
	data[7][i][j] = It[i][j];
	}
	M[1][0] = M[0][1]; /* The M array is symmetric */
	if(flag==TRUE)
		{
		M[0][0] = M[0][0] + 1.0f/sigmap;
		M[1][1] = M[1][1] + 1.0f/sigmap;
		}
	/* Invert 2*2 matrix */
	denominator = M[0][0]*M[1][1]-M[1][0]*M[0][1]; /* The determinant of M */
	MI[0][0] = M[1][1]/denominator;
	MI[0][1] = -M[0][1]/denominator;
	MI[1][0] = -M[1][0]/denominator;
	MI[1][1] = M[0][0]/denominator;

	jacobi(M,2,eigenvalues,eigenvectors,&nrot);
	if(check_eigen_calc(M,eigenvalues,eigenvectors,nrot,diff1,diff2,
		&length1,&length2,&angle)==FALSE)
		{
		if(FALSE)
		{
		printf("\n********************************************\n");
		printf("Fatal error: eigenvalue/eigenvector error\n");
		printf("i=%d j=%d\n",i,j);
		printf("eigenvalues: %f %f\n",eigenvalues[0],eigenvalues[1]);
		printf("eigenvector1: %f %f\n",eigenvectors[0][0],eigenvectors[1][0]);
		printf("eigenvector2: %f %f\n",eigenvectors[0][1],eigenvectors[1][1]);
		printf("\n      M:                        MI\n");
		printf("%12.6f %12.6f %12.6f %12.6f\n",M[0][0],M[0][1],MI[0][0],MI[0][1]);
		printf("%12.6f %12.6f %12.6f %12.6f\n",M[1][0],M[1][1],MI[1][0],MI[1][1]);
		printf("B: %f %f\n",B[0],B[1]);
		printf("Determinant of M: %f\n",denominator);
		printf("nrot: %d\n",nrot);
		printf("Angle between two eigenvectors: %f degrees\n",angle);
		printf("Difference length for eigenvector1\n");
		printf("Difference: %f %f Length: %f\n",diff1[0],diff1[1],length1);
		printf("Difference length for eigenvector2\n");
		printf("Difference: %f %f Length: %f\n",diff2[0],diff2[1],length2);
		/* Check eigenvalues/eigenvectors for 2*2 matrix using
		   closed form method as in Anandan's thesis */
		eigenvalues2[0] = 0.5*((M[0][0]+M[1][1]) -
		  sqrt((M[0][0]-M[1][1])*(M[0][0]-M[1][1])+4.0*M[0][1]*M[1][0]));
		eigenvalues2[1] = 0.5*((M[0][0]+M[1][1]) +
		  sqrt((M[0][0]-M[1][1])*(M[0][0]-M[1][1])+4.0*M[0][1]*M[1][0]));
		angle = (float) atan2(eigenvalues2[0]-M[0][0],M[0][1]);
		eigenvectors2[0][0] = (float) -cos(angle);
		eigenvectors2[1][0] = (float) -sin(angle);
		eigenvectors2[0][1] = (float) -sin(angle);
		eigenvectors2[1][1] = (float) cos(angle);
		printf("\nUsing Anandan's calculation:\n");
		printf("Angle of rotation: %f degrees\n",angle*180/HALF_C);
		printf("eigenvalues: %f %f\n",eigenvalues2[0],eigenvalues2[1]);
		printf("eigenvector1: %f %f\n",eigenvectors2[0][0],eigenvectors2[1][0]);
		printf("eigenvector2: %f %f\n",eigenvectors2[0][1],eigenvectors2[1][1]);
		check_eigen_calc(M,eigenvalues2,eigenvectors2,nrot,diff1,diff2,
				 &length1,&length2,&angle);
		printf("Angle between two eigenvectors: %f degrees\n",angle);
		printf("Difference length for eigenvector1\n");
		printf("Difference: %f %f Length: %f\n",diff1[0],diff1[1],length1);
		printf("Difference length for eigenvector2\n");
		printf("Difference: %f %f Length: %f\n",diff2[0],diff2[1],length2);
		printf("********************************************\n\n");
		fflush(stdout);
		if(FALSE) exit(1);
		}
		eigen_count++;
		}
	else
	{
	/* Sort the eigenvalues and the corresponding eigenvectors */
	/* Most likely, already ordered				   */
	if(eigenvalues[0] < eigenvalues[1]) /* Largest eigenvalue first */
		{
		/* swap eigenvalues */
		temp = eigenvalues[0];
		eigenvalues[0] = eigenvalues[1];
		eigenvalues[1] = temp;
		/* swap eigenvector components */
		temp = eigenvectors[0][0];
		eigenvectors[0][0] = eigenvectors[0][1];
		eigenvectors[0][1] = temp;
		temp = eigenvectors[1][0];
		eigenvectors[1][0] = eigenvectors[1][1];
		eigenvectors[1][1] = temp;
		no_swaps++;
		}

	/* Full velocity if spread of M is small */
	if(eigenvalues[0] >= tau_D && eigenvalues[1] >= tau_D)
	{
	if(denominator > 0.0)
		{
		full_vels[i][j][1] = -(v1= -(MI[0][0]*B[0]+MI[0][1]*B[1]));
		full_vels[i][j][0] =  (v2= -(MI[1][0]*B[0]+MI[1][1]*B[1]));
		/* Compute the residual */
		for(k=(-2);k<=2;k++)
		for(l=(-2);l<=2;l++)
			{
			temp1 = weight[k+2][l+2]*
			      (Ix[i+k][j+l]*v1+
			       Iy[i+k][j+l]*v2+It[i+k][j+l]);
			/* temp2 = weight[k+2][l+2]*It[i+k][j+l]; */
			E[i][j] += (temp1*temp1);
			}
		full_count++;
		}
	else { full_vels[i][j][0] = full_vels[i][j][1] = NO_VALUE; }
	}
	/* Normal velocity if spread of M is small in one direction only */
	else if(eigenvalues[0] > tau_D && fabs(denominator) > 0.00000001)
	/* Normal velocity if spread of MI is small in one direction only */
		{
		/* Project v onto that direction */
		v[0] = -(MI[0][0]*B[0]+MI[0][1]*B[1]);
		v[1] = -(MI[1][0]*B[0]+MI[1][1]*B[1]);
		norm_vels1[i][j][1] = -(v[0]*eigenvectors[0][0]+
				      v[1]*eigenvectors[1][0])*eigenvectors[0][0];
		norm_vels1[i][j][0] = (v[0]*eigenvectors[0][0]+
				      v[1]*eigenvectors[1][0])*eigenvectors[1][0];
		norm_count1++;
		/* if(i >= 50 && i <= 60 && j >= 50 && j <= 60)
		printf("Normal velocity at i:%d j:%d: %f %f\n",i,j,norm_vels1[i][j][0],norm_vels1[i][j][1]); */
		}
	else
		{
		/* printf("No velocity\n"); */
		no_count++;
		}
	}

	/* Compute type 2 normal velocity */
	mag = (Ix[i][j]*Ix[i][j] + Iy[i][j]*Iy[i][j]);
	Imag[i][j] = (float) sqrt(mag);
	if(Imag[i][j] > MAX_RAW_MAG) MAX_RAW_MAG = Imag[i][j];
	if(Imag[i][j] > RAW_MAG)
	{
	norm_vels2[i][j][1] =  It[i][j]*Ix[i][j]/mag;
	norm_vels2[i][j][0] = -It[i][j]*Iy[i][j]/mag;
	norm_count2++;
	}
	else mag_zero++;
	}

printf("%d full velocities computed\n",full_count);
printf("%d least squares normal velocities computed\n",norm_count1);
printf("%d raw normal velocities computed\n",norm_count2);
printf("%d locations where velocity information thresholded\n",no_count);
printf("%d locations where eigenvalue/eigenvector calculation failed\n",eigen_count);
printf("%d locations with spatial gradient is zero\n",mag_zero);
fflush(stdout);
if(DEBUG) for(kk=0;kk<8;kk++) fwrite(&data[kk][0][0], sizeof(float), 150*150, fd_temp[kk]);
}